

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlC14NPrintNamespaces(xmlNs *ns,xmlC14NCtxPtr ctx)

{
  char *str;
  xmlOutputBufferPtr out;
  int iVar1;
  
  if (ns == (xmlNs *)0x0 || ctx == (xmlC14NCtxPtr)0x0) {
    iVar1 = 0;
    xmlC14NErrFull(ctx,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0);
  }
  else {
    out = ctx->buf;
    if (ns->prefix == (xmlChar *)0x0) {
      str = " xmlns=";
    }
    else {
      xmlOutputBufferWriteString(out," xmlns:");
      xmlOutputBufferWriteString(ctx->buf,(char *)ns->prefix);
      out = ctx->buf;
      str = "=";
    }
    xmlOutputBufferWriteString(out,str);
    if (ns->href == (xmlChar *)0x0) {
      xmlOutputBufferWriteString(ctx->buf,"\"\"");
    }
    else {
      xmlOutputBufferWriteQuotedString(ctx->buf,ns->href);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
xmlC14NPrintNamespaces(const xmlNs *ns, xmlC14NCtxPtr ctx)
{

    if ((ns == NULL) || (ctx == NULL)) {
        xmlC14NErrParam(ctx);
        return 0;
    }

    if (ns->prefix != NULL) {
        xmlOutputBufferWriteString(ctx->buf, " xmlns:");
        xmlOutputBufferWriteString(ctx->buf, (const char *) ns->prefix);
        xmlOutputBufferWriteString(ctx->buf, "=");
    } else {
        xmlOutputBufferWriteString(ctx->buf, " xmlns=");
    }
    if(ns->href != NULL) {
	xmlOutputBufferWriteQuotedString(ctx->buf, ns->href);
    } else {
    	xmlOutputBufferWriteString(ctx->buf, "\"\"");
    }
    return (1);
}